

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_when(lyout *out,int level,lys_module *module,lys_when *when)

{
  int level_00;
  uint in_EAX;
  char *text;
  undefined8 uStack_38;
  int flag;
  
  uStack_38 = (ulong)in_EAX;
  text = transform_json2schema(module,when->cond);
  if (text != (char *)0x0) {
    ly_print(out,"%*swhen \"",(ulong)(uint)(level * 2));
    yang_encode(out,text,-1);
    ly_print(out,"\"");
    lydict_remove(module->ctx,text);
    level_00 = level + 1;
    if (when->ext_size != '\0') {
      yang_print_open(out,(int *)((long)&uStack_38 + 4));
      yang_print_extension_instances
                (out,level_00,module,LYEXT_SUBSTMT_SELF,'\0',when->ext,(uint)when->ext_size);
    }
    if (when->dsc != (char *)0x0) {
      yang_print_open(out,(int *)((long)&uStack_38 + 4));
      yang_print_substmt(out,level_00,LYEXT_SUBSTMT_DESCRIPTION,'\0',when->dsc,module,when->ext,
                         (uint)when->ext_size);
    }
    if (when->ref != (char *)0x0) {
      yang_print_open(out,(int *)((long)&uStack_38 + 4));
      yang_print_substmt(out,level_00,LYEXT_SUBSTMT_REFERENCE,'\0',when->ref,module,when->ext,
                         (uint)when->ext_size);
    }
    yang_print_close(out,level,uStack_38._4_4_);
    return;
  }
  ly_print(out,"(!error!)");
  return;
}

Assistant:

static void
yang_print_when(struct lyout *out, int level, const struct lys_module *module, const struct lys_when *when)
{
    int flag = 0;
    const char *str;

    str = transform_json2schema(module, when->cond);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*swhen \"", LEVEL, INDENT);
    yang_encode(out, str, -1);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    level++;

    if (when->ext_size) {
        /* extension is stored in lys_when incompatible with lys_node, so we cannot use yang_print_snode_common() */
        yang_print_open(out, &flag);
        yang_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, when->ext, when->ext_size);
    }
    if (when->dsc != NULL) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, when->dsc,
                           module, when->ext, when->ext_size);
    }
    if (when->ref != NULL) {
        yang_print_open(out, &flag);
        yang_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, when->ref,
                           module, when->ext, when->ext_size);
    }

    level--;
    yang_print_close(out, level, flag);
}